

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdApi.c
# Opt level: O1

int Cmd_CommandHandleSpecial(Abc_Frame_t *pAbc,char *sCommand)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  double dVar10;
  double dVar11;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  uVar3 = 0;
  if ((pNtk != (Abc_Ntk_t *)0x0) && (pNtk->ntkFunc == ABC_FUNC_MAP)) {
    uVar3 = pNtk->vCis->nSize;
  }
  uVar2 = 0;
  if ((pNtk != (Abc_Ntk_t *)0x0) && (uVar2 = 0, pNtk->ntkFunc == ABC_FUNC_MAP)) {
    uVar2 = pNtk->vCos->nSize;
  }
  uVar6 = 0;
  if ((pNtk != (Abc_Ntk_t *)0x0) && (uVar6 = 0, pNtk->ntkFunc == ABC_FUNC_MAP)) {
    uVar6 = pNtk->nObjCounts[7];
  }
  dVar10 = 0.0;
  if ((pNtk != (Abc_Ntk_t *)0x0) && (pNtk->ntkFunc == ABC_FUNC_MAP)) {
    dVar10 = Abc_NtkGetMappedArea(pNtk);
  }
  uVar1 = 0;
  if ((pNtk != (Abc_Ntk_t *)0x0) && (uVar1 = 0, pNtk->ntkFunc == ABC_FUNC_MAP)) {
    uVar1 = Abc_NtkLevel(pNtk);
  }
  pcVar4 = strstr(sCommand,"#PS");
  if (pcVar4 != (char *)0x0) {
    printf("pi=%d ",(ulong)uVar3);
    printf("po=%d ",(ulong)uVar2);
    printf("fn=%d ",(ulong)uVar6);
    printf("ma=%.1f ",dVar10);
    printf("de=%d ",(ulong)uVar1);
    putchar(10);
    return 1;
  }
  pcVar4 = strstr(sCommand,"#CEC");
  if (pcVar4 != (char *)0x0) {
    printf("proofStatus=%d\n",1);
    return 1;
  }
  pcVar4 = strstr(sCommand,"#ASSERT");
  if (pcVar4 == (char *)0x0) {
    return 0;
  }
  pcVar4 = strrchr(sCommand,0x3d);
  pcVar5 = strstr(sCommand,"_PI_");
  if (pcVar5 == (char *)0x0) {
    pcVar5 = strstr(sCommand,"_PO_");
    if (pcVar5 == (char *)0x0) {
      pcVar5 = strstr(sCommand,"_NODE_");
      if (pcVar5 == (char *)0x0) {
        pcVar5 = strstr(sCommand,"_AREA_");
        if (pcVar5 != (char *)0x0) {
          if (pcVar4 == (char *)0x0) {
            dVar11 = 0.0;
          }
          else {
            dVar11 = atof(pcVar4 + 1);
          }
          pcVar4 = strstr(sCommand,"==");
          if (pcVar4 == (char *)0x0) {
            pcVar4 = strstr(sCommand,"<=");
            if (pcVar4 != (char *)0x0) {
              bVar7 = dVar10 <= dVar11 + 1.0;
              goto LAB_00320176;
            }
            bVar8 = false;
            bVar7 = false;
          }
          else {
            bVar7 = dVar10 <= dVar11 + 1.0 && dVar11 + -1.0 <= dVar10;
LAB_00320176:
            bVar8 = true;
          }
          if (!bVar8) {
            return 0;
          }
          goto LAB_003200ab;
        }
        pcVar5 = strstr(sCommand,"_DEPTH_");
        if (pcVar5 == (char *)0x0) {
          return 0;
        }
        if (pcVar4 == (char *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = atoi(pcVar4 + 1);
        }
        pcVar4 = strstr(sCommand,"==");
        if (pcVar4 != (char *)0x0) {
          bVar7 = uVar1 == uVar3;
          goto LAB_003200ab;
        }
        pcVar4 = strstr(sCommand,"<=");
        if (pcVar4 == (char *)0x0) {
          return 0;
        }
        bVar9 = SBORROW4(uVar1,uVar3);
        bVar8 = (int)(uVar1 - uVar3) < 0;
        bVar7 = uVar1 == uVar3;
      }
      else {
        if (pcVar4 == (char *)0x0) {
          uVar3 = 0;
        }
        else {
          uVar3 = atoi(pcVar4 + 1);
        }
        pcVar4 = strstr(sCommand,"==");
        if (pcVar4 != (char *)0x0) {
          bVar7 = uVar6 == uVar3;
          goto LAB_003200ab;
        }
        pcVar4 = strstr(sCommand,"<=");
        if (pcVar4 == (char *)0x0) {
          return 0;
        }
        bVar9 = SBORROW4(uVar6,uVar3);
        bVar8 = (int)(uVar6 - uVar3) < 0;
        bVar7 = uVar6 == uVar3;
      }
    }
    else {
      if (pcVar4 == (char *)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = atoi(pcVar4 + 1);
      }
      pcVar4 = strstr(sCommand,"==");
      if (pcVar4 != (char *)0x0) {
        bVar7 = uVar2 == uVar3;
        goto LAB_003200ab;
      }
      pcVar4 = strstr(sCommand,"<=");
      if (pcVar4 == (char *)0x0) {
        return 0;
      }
      bVar9 = SBORROW4(uVar2,uVar3);
      bVar8 = (int)(uVar2 - uVar3) < 0;
      bVar7 = uVar2 == uVar3;
    }
  }
  else {
    if (pcVar4 == (char *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = atoi(pcVar4 + 1);
    }
    pcVar4 = strstr(sCommand,"==");
    if (pcVar4 != (char *)0x0) {
      bVar7 = uVar3 == uVar2;
      goto LAB_003200ab;
    }
    pcVar4 = strstr(sCommand,"<=");
    if (pcVar4 == (char *)0x0) {
      return 0;
    }
    bVar9 = SBORROW4(uVar3,uVar2);
    bVar8 = (int)(uVar3 - uVar2) < 0;
    bVar7 = uVar3 == uVar2;
  }
  bVar7 = bVar7 || bVar9 != bVar8;
LAB_003200ab:
  pcVar4 = "failed";
  if (bVar7) {
    pcVar4 = "succeeded";
  }
  puts(pcVar4);
  return 1;
}

Assistant:

int Cmd_CommandHandleSpecial( Abc_Frame_t * pAbc, const char * sCommand )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int piCountNew = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkCiNum(pNtk)         : 0, piCount = 0;
    int poCountNew = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkCoNum(pNtk)         : 0, poCount = 0;
    int ndCountNew = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkNodeNum(pNtk)       : 0, ndCount = 0;
    double AreaNew = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkGetMappedArea(pNtk) : 0, Area    = 0;
    int DepthNew   = (pNtk && Abc_NtkHasMapping(pNtk)) ? Abc_NtkLevel(pNtk)         : 0, Depth   = 0;
    if ( strstr(sCommand, "#PS") ) 
    {
        printf( "pi=%d ",   piCountNew );
        printf( "po=%d ",   poCountNew );
        printf( "fn=%d ",   ndCountNew );
        printf( "ma=%.1f ", AreaNew    );
        printf( "de=%d ",   DepthNew   );
        printf( "\n" );
        return 1;
    }
    if ( strstr(sCommand, "#CEC") ) 
    {
        //int proofStatus = Abc_NtkVerifyUsingCec(pNtk);
        int proofStatus = 1;
        // -1 (undecided), 0 (different), 1 (equivalent)
        printf( "proofStatus=%d\n", proofStatus );
        return 1;
    }
    if ( strstr(sCommand, "#ASSERT") ) 
    {
        int Status    = 0;
        char * pNumb  = strrchr( (char *)sCommand, '=' );
        if ( strstr(sCommand, "_PI_") ) 
        {
            piCount = pNumb ? atoi(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = piCountNew == piCount;
            else if ( strstr( sCommand, "<=" ) )
                Status = piCountNew <= piCount;
            else return 0;
        }
        else if ( strstr(sCommand, "_PO_") ) 
        {
            poCount = pNumb ? atoi(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = poCountNew == poCount;
            else if ( strstr( sCommand, "<=" ) )
                Status = poCountNew <= poCount;
            else return 0;
        }
        else if ( strstr(sCommand, "_NODE_") ) 
        {
            ndCount = pNumb ? atoi(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = ndCountNew == ndCount;
            else if ( strstr( sCommand, "<=" ) )
                Status = ndCountNew <= ndCount;
            else return 0;
        }
        else if ( strstr(sCommand, "_AREA_") ) 
        {
            double Eplison = 1.0;
            Area = pNumb ? atof(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = AreaNew >= Area - Eplison && AreaNew <= Area + Eplison;
            else if ( strstr( sCommand, "<=" ) )
                Status = AreaNew <= Area + Eplison;
            else return 0;
        }
        else if ( strstr(sCommand, "_DEPTH_") ) 
        {
            Depth = pNumb ? atoi(pNumb+1) : 0;
            if ( strstr( sCommand, "==" ) )
                Status = DepthNew == Depth;
            else if ( strstr( sCommand, "<=" ) )
                Status = DepthNew <= Depth;
            else return 0;
        }
        else return 0;
        printf( "%s\n", Status ? "succeeded" : "failed" );
        return 1;
    }
    return 0;
}